

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O3

void __thiscall GLDrawList::MakeSortList(GLDrawList *this)

{
  SortNode *pSVar1;
  SortNode *pSVar2;
  uint uVar3;
  SortNode *pSVar4;
  uint uVar5;
  
  this->SortNodeStart = SortNodes.usecount;
  pSVar1 = StaticSortNodeArray::GetNew(&SortNodes);
  uVar3 = (this->drawitems).Count;
  if (uVar3 != 0) {
    uVar5 = 0;
    pSVar2 = (SortNode *)0x0;
    do {
      pSVar1->itemindex = uVar5;
      pSVar1->left = (SortNode *)0x0;
      pSVar1->equal = (SortNode *)0x0;
      pSVar1->right = (SortNode *)0x0;
      pSVar1->parent = pSVar2;
      if (uVar5 == uVar3 - 1) {
        pSVar2 = (SortNode *)0x0;
        pSVar4 = pSVar1;
      }
      else {
        pSVar2 = StaticSortNodeArray::GetNew(&SortNodes);
        uVar3 = (this->drawitems).Count;
        pSVar4 = pSVar2;
      }
      pSVar1->next = pSVar2;
      uVar5 = uVar5 + 1;
      pSVar2 = pSVar1;
      pSVar1 = pSVar4;
    } while (uVar5 < uVar3);
  }
  return;
}

Assistant:

void GLDrawList::MakeSortList()
{
	SortNode * p, * n, * c;
	unsigned i;

	SortNodeStart=SortNodes.Size();
	p=NULL;
	n=SortNodes.GetNew();
	for(i=0;i<drawitems.Size();i++)
	{
		n->itemindex=(int)i;
		n->left=n->equal=n->right=NULL;
		n->parent=p;
		p=n;
		if (i!=drawitems.Size()-1)
		{
			c=SortNodes.GetNew();
			n->next=c;
			n=c;
		}
		else
		{
			n->next=NULL;
		}
	}
}